

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# neural_net.cpp
# Opt level: O1

vector<double,_std::allocator<double>_> * __thiscall
Net::propagate_back(vector<double,_std::allocator<double>_> *__return_storage_ptr__,Net *this,
                   int cur_layer,vector<double,_std::allocator<double>_> *y,
                   vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
                   *derivative,
                   vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   *bias_derivative)

{
  long lVar1;
  pointer pdVar2;
  vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
  *pvVar3;
  vector<double,_std::allocator<double>_> *pvVar4;
  long lVar5;
  int iVar6;
  pointer pvVar7;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  double dVar11;
  double dVar12;
  Layer lol;
  vector<double,_std::allocator<double>_> local_90;
  vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
  *local_78;
  vector<double,_std::allocator<double>_> *local_70;
  vector<double,_std::allocator<double>_> local_68;
  long local_50;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *local_48;
  long local_40;
  ulong local_38;
  
  lVar8 = (long)cur_layer;
  pvVar7 = (this->mesh).
           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_78 = derivative;
  local_48 = bias_derivative;
  if (((long)(this->mesh).
             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar7 >> 3) * -0x5555555555555555 +
      -1 != lVar8) {
    add_matrix<double>(&local_90,y,pvVar7 + lVar8);
    std::vector<double,_std::allocator<double>_>::_M_move_assign(y,&local_90);
    if (local_90.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start != (pointer)0x0) {
      operator_delete(local_90.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_90.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_90.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
  }
  iVar6 = cur_layer + -1;
  pvVar7 = (this->mesh).
           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_70 = y;
  std::vector<double,_std::allocator<double>_>::vector
            (__return_storage_ptr__,
             (long)*(pointer *)
                    ((long)&pvVar7[iVar6].super__Vector_base<double,_std::allocator<double>_>.
                            _M_impl.super__Vector_impl_data + 8) -
             *(long *)&pvVar7[iVar6].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data >> 3,(allocator_type *)&local_90);
  pvVar7 = (this->mesh).
           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (*(pointer *)
       ((long)&pvVar7[lVar8].super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data + 8) !=
      pvVar7[lVar8].super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start) {
    uVar10 = 0;
    local_50 = lVar8 * 3;
    do {
      lVar1 = local_50;
      pvVar3 = local_78;
      dVar11 = derivative_function(this,*(double *)
                                         (*(long *)&(this->meshZ).
                                                                                                        
                                                  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[lVar8].
                                                  super__Vector_base<double,_std::allocator<double>_>
                                                  ._M_impl.super__Vector_impl_data + uVar10 * 8));
      local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)((*(double *)
                             (*(long *)&(this->mesh).
                                        super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start[lVar8].
                                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                        super__Vector_impl_data + uVar10 * 8) -
                           (local_70->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                           super__Vector_impl_data._M_start[uVar10]) * (dVar11 + dVar11));
      mult_matrix_on_constant<double>(&local_90,pvVar7 + iVar6,(double *)&local_68);
      local_40 = uVar10 * 3;
      add_matrix<double>(&local_68,
                         (vector<double,_std::allocator<double>_> *)
                         (*(long *)((long)&(((pvVar3->
                                             super__Vector_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
                                             )._M_impl.super__Vector_impl_data._M_start)->
                                           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                           )._M_impl.super__Vector_impl_data + lVar1 * 8) +
                         uVar10 * 0x18),&local_90);
      std::vector<double,_std::allocator<double>_>::_M_move_assign
                ((vector<double,_std::allocator<double>_> *)
                 (uVar10 * 0x18 +
                 *(long *)((long)&(((pvVar3->
                                    super__Vector_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_start)->
                                  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                  )._M_impl.super__Vector_impl_data + lVar1 * 8)),&local_68);
      if (local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      dVar11 = derivative_function(this,*(double *)
                                         (*(long *)&(this->meshZ).
                                                                                                        
                                                  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[lVar8].
                                                  super__Vector_base<double,_std::allocator<double>_>
                                                  ._M_impl.super__Vector_impl_data + uVar10 * 8));
      lVar5 = local_40;
      pvVar4 = local_70;
      lVar1 = *(long *)&(local_48->
                        super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_start[lVar8].
                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data;
      *(double *)(lVar1 + uVar10 * 8) =
           (*(double *)
             (*(long *)&(this->mesh).
                        super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[lVar8].
                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data + uVar10 * 8) -
           (local_70->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start[uVar10]) * (dVar11 + dVar11) +
           *(double *)(lVar1 + uVar10 * 8);
      pvVar7 = (this->mesh).
               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if (*(pointer *)
           ((long)&pvVar7[iVar6].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data + 8) !=
          pvVar7[iVar6].super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start) {
        uVar9 = 0;
        local_38 = uVar10;
        do {
          dVar11 = *(double *)
                    (*(long *)(*(long *)&(this->weights).
                                         super__Vector_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start[lVar8].
                                         super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                         ._M_impl.super__Vector_impl_data + lVar5 * 8) + uVar9 * 8);
          dVar12 = derivative_function(this,*(double *)
                                             (*(long *)&(this->meshZ).
                                                                                                                
                                                  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[lVar8].
                                                  super__Vector_base<double,_std::allocator<double>_>
                                                  ._M_impl.super__Vector_impl_data + local_38 * 8));
          pdVar2 = (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>).
                   _M_impl.super__Vector_impl_data._M_start;
          pdVar2[local_38] =
               (*(double *)
                 (*(long *)&(this->mesh).
                            super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[lVar8].
                            super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data + local_38 * 8) -
               (pvVar4->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start[local_38]) * (dVar11 + dVar11) * dVar12 +
               pdVar2[local_38];
          uVar9 = uVar9 + 1;
          pvVar7 = (this->mesh).
                   super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          uVar10 = local_38;
        } while (uVar9 < (ulong)((long)*(pointer *)
                                        ((long)&pvVar7[iVar6].
                                                super__Vector_base<double,_std::allocator<double>_>.
                                                _M_impl.super__Vector_impl_data + 8) -
                                 *(long *)&pvVar7[iVar6].
                                           super__Vector_base<double,_std::allocator<double>_>.
                                           _M_impl.super__Vector_impl_data >> 3));
      }
      if (local_90.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_90.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_90.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_90.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      uVar10 = uVar10 + 1;
      pvVar7 = (this->mesh).
               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    } while (uVar10 < (ulong)(*(long *)((long)&(pvVar7->
                                               super__Vector_base<double,_std::allocator<double>_>).
                                               _M_impl.super__Vector_impl_data + local_50 * 8 + 8) -
                              *(long *)((long)&(pvVar7->
                                               super__Vector_base<double,_std::allocator<double>_>).
                                               _M_impl.super__Vector_impl_data + local_50 * 8) >> 3)
            );
  }
  local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0xbff0000000000000;
  mult_matrix_on_constant<double>(&local_90,__return_storage_ptr__,(double *)&local_68);
  std::vector<double,_std::allocator<double>_>::_M_move_assign(__return_storage_ptr__,&local_90);
  if (local_90.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_90.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_90.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_90.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<double> Net::propagate_back(int cur_layer, std::vector<double> y, std::vector<std::vector<Layer> >& derivative, std::vector<Layer>& bias_derivative){
    if (cur_layer != mesh.size()-1) y = add_matrix(y, mesh[cur_layer]);
    std::vector<double> y_prev(mesh[cur_layer-1].size());
    for (int i = 0; i < mesh[cur_layer].size(); ++i) {
        Layer lol = mult_matrix_on_constant(mesh[cur_layer-1], (2 * derivative_function(meshZ[cur_layer][i]) * (mesh[cur_layer][i] - y[i])));
        derivative[cur_layer][i] = add_matrix(derivative[cur_layer][i], lol);
        bias_derivative[cur_layer][i] += (2 * derivative_function(meshZ[cur_layer][i]) * (mesh[cur_layer][i] - y[i]));
        for (int j = 0; j < mesh[cur_layer-1].size(); ++j)
            y_prev[i] += (2 * weights[cur_layer][i][j] * derivative_function(meshZ[cur_layer][i]) * (mesh[cur_layer][i] - y[i]));

//        threshold(derivative[cur_layer][i], MOD); derivative_function
    }
//    threshold(y_prev, 1.0);
//    threshold(bias_derivative[cur_layer], MOD);
    y_prev = mult_matrix_on_constant(y_prev, -1.0);
    return y_prev;
}